

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bilinear.h
# Opt level: O0

void ncnn::linear_coeffs(int w,int outw,int *xofs,float *alpha,int align_corner)

{
  float fVar1;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  double dVar2;
  int sx;
  float fx;
  int dx;
  double scale;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  
  fVar1 = (float)in_EDI / (float)in_ESI;
  if (in_R8D != 0) {
    fVar1 = (float)(in_EDI + -1) / (float)(in_ESI + -1);
  }
  for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
    local_30 = ((float)local_2c + 0.5) * fVar1 - 0.5;
    if (in_R8D != 0) {
      local_30 = (float)local_2c * fVar1;
    }
    dVar2 = std::floor((double)(ulong)(uint)local_30);
    local_34 = (int)SUB84(dVar2,0);
    local_30 = local_30 - (float)local_34;
    if (local_34 < 0) {
      local_34 = 0;
      local_30 = 0.0;
    }
    if (in_EDI + -1 <= local_34) {
      local_34 = in_EDI + -2;
      local_30 = 1.0;
    }
    *(int *)(in_RDX + (long)local_2c * 4) = local_34;
    *(float *)(in_RCX + (long)(local_2c << 1) * 4) = 1.0 - local_30;
    *(float *)(in_RCX + (long)(local_2c * 2 + 1) * 4) = local_30;
  }
  return;
}

Assistant:

static void linear_coeffs(int w, int outw, int* xofs, float* alpha, int align_corner)
{
    double scale = (double)w / outw;
    if (align_corner)
    {
        scale = (double)(w - 1) / (outw - 1);
    }

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        if (align_corner)
        {
            fx = (float)(dx * scale);
        }

        int sx = floor(fx);
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 2;
            fx = 1.f;
        }

        xofs[dx] = sx;

        alpha[dx * 2] = 1.f - fx;
        alpha[dx * 2 + 1] = fx;
    }
}